

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickcdef.c
# Opt level: O0

void av1_pick_cdef_from_qp(AV1_COMMON *cm,int skip_cdef,int is_screen_content)

{
  aom_bit_depth_t aVar1;
  int16_t iVar2;
  int iVar3;
  int iVar4;
  int in_EDX;
  int in_ESI;
  AV1_COMMON *in_RDI;
  float fVar5;
  MB_MODE_INFO *current_mbmi;
  int c;
  int r;
  MB_MODE_INFO **mbmi;
  int nhfb;
  int nvfb;
  CommonModeInfoParams *mi_params;
  int predicted_uv_f2;
  int predicted_uv_f1;
  int predicted_y_f2;
  int predicted_y_f1;
  CdefInfo *cdef_info;
  int q;
  int bd;
  undefined8 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  int iVar6;
  int local_4c;
  MB_MODE_INFO **local_48;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  
  aVar1 = in_RDI->seq_params->bit_depth;
  iVar2 = av1_ac_quant_QTX(in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20)
                           ,(aom_bit_depth_t)in_stack_ffffffffffffffa8);
  iVar3 = (int)iVar2 >> ((char)aVar1 - 8U & 0x1f);
  if (in_ESI == 0) {
    (in_RDI->cdef_info).cdef_bits = 0;
    (in_RDI->cdef_info).nb_cdef_strengths = 1;
  }
  else {
    (in_RDI->cdef_info).cdef_bits = 1;
    (in_RDI->cdef_info).nb_cdef_strengths = 2;
  }
  (in_RDI->cdef_info).cdef_damping = ((in_RDI->quant_params).base_qindex >> 6) + 3;
  if (in_EDX == 0) {
    iVar4 = frame_is_intra_only(in_RDI);
    if (iVar4 == 0) {
      fVar5 = roundf((float)(iVar3 * iVar3) * -2.3593946e-06 + (float)iVar3 * 0.0068615186 +
                     0.02709886);
      local_24 = clamp((int)fVar5,0,0xf);
      fVar5 = roundf((float)(iVar3 * iVar3) * -5.7629734e-07 + (float)iVar3 * 0.0013993345 +
                     0.03831067);
      local_28 = clamp((int)fVar5,0,3);
      fVar5 = roundf((float)(iVar3 * iVar3) * -7.095069e-07 + (float)iVar3 * 0.0034628846 +
                     0.00887099);
      local_2c = clamp((int)fVar5,0,0xf);
      fVar5 = roundf((float)(iVar3 * iVar3) * 2.3874085e-07 + (float)iVar3 * 0.00028223585 +
                     0.05576307);
      local_30 = clamp((int)fVar5,0,3);
    }
    else {
      fVar5 = roundf((float)(iVar3 * iVar3) * 3.3731974e-06 + (float)iVar3 * 0.008070594 + 0.0187634
                    );
      local_24 = clamp((int)fVar5,0,0xf);
      fVar5 = roundf((float)(iVar3 * iVar3) * 2.9167343e-06 + (float)iVar3 * 0.0027798624 +
                     0.0079405);
      local_28 = clamp((int)fVar5,0,3);
      fVar5 = roundf(((float)(iVar3 * iVar3) * -1.30790995e-05 + (float)iVar3 * 0.012892405) -
                     0.00748388);
      local_2c = clamp((int)fVar5,0,0xf);
      fVar5 = roundf((float)(iVar3 * iVar3) * 3.2651783e-06 + (float)iVar3 * 0.00035520183 +
                     0.00228092);
      local_30 = clamp((int)fVar5,0,3);
    }
  }
  else {
    local_24 = clamp((int)((double)iVar3 * 5.88217781e-06 * (double)iVar3 +
                           (double)iVar3 * 0.00610391455 + 0.0995043102),0,0xf);
    local_28 = clamp((int)((double)iVar3 * -7.79934857e-06 * (double)iVar3 +
                           (double)iVar3 * 0.0065895783 + 0.881045025),0,3);
    local_2c = clamp((int)((double)iVar3 * -6.79500136e-06 * (double)iVar3 +
                           (double)iVar3 * 0.0102695586 + 0.136126802),0,0xf);
    local_30 = clamp((int)((double)iVar3 * -9.99613695e-08 * (double)iVar3 +
                           -((double)iVar3 * 1.79361339e-05) + 1.17022324),0,3);
  }
  (in_RDI->cdef_info).cdef_strengths[0] = local_24 * 4 + local_28;
  (in_RDI->cdef_info).cdef_uv_strengths[0] = local_2c * 4 + local_30;
  if (in_ESI == 0) {
    iVar3 = (in_RDI->mi_params).mi_rows;
    iVar4 = (in_RDI->mi_params).mi_cols;
    local_48 = (in_RDI->mi_params).mi_grid_base;
    if (local_48 != (MB_MODE_INFO **)0x0) {
      for (local_4c = 0; local_4c < (iVar3 + 0xf) / 0x10; local_4c = local_4c + 1) {
        for (iVar6 = 0; iVar6 < (iVar4 + 0xf) / 0x10; iVar6 = iVar6 + 1) {
          *(ushort *)&local_48[iVar6 << 4]->field_0xa7 =
               *(ushort *)&local_48[iVar6 << 4]->field_0xa7 & 0x87ff;
        }
        local_48 = local_48 + ((in_RDI->mi_params).mi_stride << 4);
      }
    }
  }
  else {
    (in_RDI->cdef_info).cdef_strengths[1] = 0;
    (in_RDI->cdef_info).cdef_uv_strengths[1] = 0;
  }
  return;
}

Assistant:

void av1_pick_cdef_from_qp(AV1_COMMON *const cm, int skip_cdef,
                           int is_screen_content) {
  const int bd = cm->seq_params->bit_depth;
  const int q =
      av1_ac_quant_QTX(cm->quant_params.base_qindex, 0, bd) >> (bd - 8);
  CdefInfo *const cdef_info = &cm->cdef_info;
  // Check the speed feature to avoid extra signaling.
  if (skip_cdef) {
    cdef_info->cdef_bits = 1;
    cdef_info->nb_cdef_strengths = 2;
  } else {
    cdef_info->cdef_bits = 0;
    cdef_info->nb_cdef_strengths = 1;
  }
  cdef_info->cdef_damping = 3 + (cm->quant_params.base_qindex >> 6);

  int predicted_y_f1 = 0;
  int predicted_y_f2 = 0;
  int predicted_uv_f1 = 0;
  int predicted_uv_f2 = 0;
  if (is_screen_content) {
    predicted_y_f1 =
        (int)(5.88217781e-06 * q * q + 6.10391455e-03 * q + 9.95043102e-02);
    predicted_y_f2 =
        (int)(-7.79934857e-06 * q * q + 6.58957830e-03 * q + 8.81045025e-01);
    predicted_uv_f1 =
        (int)(-6.79500136e-06 * q * q + 1.02695586e-02 * q + 1.36126802e-01);
    predicted_uv_f2 =
        (int)(-9.99613695e-08 * q * q - 1.79361339e-05 * q + 1.17022324e+0);
    predicted_y_f1 = clamp(predicted_y_f1, 0, 15);
    predicted_y_f2 = clamp(predicted_y_f2, 0, 3);
    predicted_uv_f1 = clamp(predicted_uv_f1, 0, 15);
    predicted_uv_f2 = clamp(predicted_uv_f2, 0, 3);
  } else {
    if (!frame_is_intra_only(cm)) {
      predicted_y_f1 = clamp((int)roundf(q * q * -0.0000023593946f +
                                         q * 0.0068615186f + 0.02709886f),
                             0, 15);
      predicted_y_f2 = clamp((int)roundf(q * q * -0.00000057629734f +
                                         q * 0.0013993345f + 0.03831067f),
                             0, 3);
      predicted_uv_f1 = clamp((int)roundf(q * q * -0.0000007095069f +
                                          q * 0.0034628846f + 0.00887099f),
                              0, 15);
      predicted_uv_f2 = clamp((int)roundf(q * q * 0.00000023874085f +
                                          q * 0.00028223585f + 0.05576307f),
                              0, 3);
    } else {
      predicted_y_f1 = clamp(
          (int)roundf(q * q * 0.0000033731974f + q * 0.008070594f + 0.0187634f),
          0, 15);
      predicted_y_f2 = clamp((int)roundf(q * q * 0.0000029167343f +
                                         q * 0.0027798624f + 0.0079405f),
                             0, 3);
      predicted_uv_f1 = clamp((int)roundf(q * q * -0.0000130790995f +
                                          q * 0.012892405f - 0.00748388f),
                              0, 15);
      predicted_uv_f2 = clamp((int)roundf(q * q * 0.0000032651783f +
                                          q * 0.00035520183f + 0.00228092f),
                              0, 3);
    }
  }
  cdef_info->cdef_strengths[0] =
      predicted_y_f1 * CDEF_SEC_STRENGTHS + predicted_y_f2;
  cdef_info->cdef_uv_strengths[0] =
      predicted_uv_f1 * CDEF_SEC_STRENGTHS + predicted_uv_f2;

  // mbmi->cdef_strength is already set in the encoding stage. We don't need to
  // set it again here.
  if (skip_cdef) {
    cdef_info->cdef_strengths[1] = 0;
    cdef_info->cdef_uv_strengths[1] = 0;
    return;
  }

  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const int nvfb = (mi_params->mi_rows + MI_SIZE_64X64 - 1) / MI_SIZE_64X64;
  const int nhfb = (mi_params->mi_cols + MI_SIZE_64X64 - 1) / MI_SIZE_64X64;
  MB_MODE_INFO **mbmi = mi_params->mi_grid_base;
  // mbmi is NULL when real-time rate control library is used.
  if (!mbmi) return;
  for (int r = 0; r < nvfb; ++r) {
    for (int c = 0; c < nhfb; ++c) {
      MB_MODE_INFO *current_mbmi = mbmi[MI_SIZE_64X64 * c];
      current_mbmi->cdef_strength = 0;
    }
    mbmi += MI_SIZE_64X64 * mi_params->mi_stride;
  }
}